

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  ushort uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ushort *puVar5;
  unsigned_long_long uVar6;
  BYTE *ipstart;
  long lVar7;
  ZSTD_frameHeader *pZVar8;
  uint uVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  ZSTD_frameSizeInfo ZVar13;
  ZSTD_frameHeader zfh;
  ZSTD_frameHeader local_38;
  
  pZVar8 = &local_38;
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar3 = ZSTD_getFrameHeader_advanced(&local_38,src,srcSize,ZSTD_f_zstd1);
    uVar2 = 0xffffffffffffffb8;
    if (0xffffffffffffff88 < sVar3) {
      uVar2 = sVar3;
    }
    uVar6 = 0xfffffffffffffffe;
    if (sVar3 == 0) {
      puVar5 = (ushort *)((long)src + (ulong)local_38.headerSize);
      uVar12 = srcSize - local_38.headerSize;
      lVar7 = 0;
      uVar4 = uVar2;
      do {
        uVar2 = 0xffffffffffffffb8;
        if (2 < uVar12) {
          uVar1 = *puVar5;
          pZVar8 = (ZSTD_frameHeader *)(ulong)(uVar1 & 1);
          uVar9 = uVar1 >> 1 & 3;
          uVar2 = (ulong)uVar9;
          if (uVar9 != 1) {
            if (uVar9 == 3) {
              uVar2 = 0xffffffffffffffec;
            }
            else {
              uVar2 = (ulong)(uint3)(CONCAT12((char)puVar5[1],uVar1) >> 3);
            }
          }
        }
        cVar11 = '\x01';
        if (uVar2 < 0xffffffffffffff89) {
          uVar10 = uVar2 + 3;
          if (uVar12 < uVar10) {
            uVar2 = 0xffffffffffffffb8;
          }
          else {
            puVar5 = (ushort *)((long)puVar5 + uVar10);
            lVar7 = lVar7 + 1;
            cVar11 = ((int)pZVar8 != 0) * '\x03';
            uVar2 = uVar4;
            uVar12 = uVar12 - uVar10;
          }
        }
        uVar4 = uVar2;
      } while (cVar11 == '\0');
      if (cVar11 == '\x03') {
        if (local_38.checksumFlag != 0) {
          uVar2 = 0xffffffffffffffb8;
          if (uVar12 < 4) goto LAB_00160627;
          puVar5 = puVar5 + 2;
        }
        uVar2 = (long)puVar5 - (long)src;
        uVar6 = lVar7 * (ulong)local_38.blockSizeMax;
        if (local_38.frameContentSize != 0xffffffffffffffff) {
          uVar6 = local_38.frameContentSize;
        }
      }
    }
  }
  else {
    uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
    uVar4 = 0xffffffffffffffb8;
    if (uVar2 <= srcSize) {
      uVar4 = uVar2;
    }
    uVar2 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      uVar2 = uVar4;
    }
    if (srcSize < uVar2 && uVar2 < 0xffffffffffffff89) {
      __assert_fail("ZSTD_isError(frameSizeInfo.compressedSize) || frameSizeInfo.compressedSize <= srcSize"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5b7a,"ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void *, size_t)");
    }
    uVar6 = 0;
  }
LAB_00160627:
  ZVar13.decompressedBound = uVar6;
  ZVar13.compressedSize = uVar2;
  return ZVar13;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = ip - ipstart;
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}